

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveArea.cpp
# Opt level: O0

void __thiscall CDirectiveArea::Encode(CDirectiveArea *this)

{
  bool bVar1;
  Architecture *pAVar2;
  pointer pCVar3;
  unsigned_long *puVar4;
  unsigned_long local_70;
  CDirectiveArea *local_68;
  size_t part;
  size_t writeSize;
  uchar buffer [64];
  int64_t subAreaUsage;
  CDirectiveArea *this_local;
  
  bVar1 = Expression::isLoaded(&this->positionExpression);
  if (bVar1) {
    pAVar2 = Architecture::current();
    (*pAVar2->_vptr_Architecture[3])();
    FileManager::seekVirtual(g_fileManager,this->position);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->content);
  if (bVar1) {
    pCVar3 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                       (&this->content);
    (*pCVar3->_vptr_CAssemblerCommand[3])();
  }
  bVar1 = Expression::isLoaded(&this->fillExpression);
  if (bVar1) {
    buffer._56_8_ = Allocations::getSubAreaUsage(this->fileID,this->position);
    if (buffer._56_8_ != 0) {
      FileManager::advanceMemory(g_fileManager,buffer._56_8_);
    }
    memset(&writeSize,(uint)(byte)this->fillValue,0x40);
    for (part = (this->areaSize - this->contentSize) - buffer._56_8_; part != 0;
        part = part - (long)local_68) {
      local_70 = 0x40;
      puVar4 = std::min<unsigned_long>(&local_70,&part);
      local_68 = (CDirectiveArea *)*puVar4;
      FileManager::write(g_fileManager,(int)&writeSize,local_68,(size_t)this);
      this = local_68;
    }
  }
  else if (((this->super_CAssemblerCommand).field_0x14 & 1) != 0) {
    FileManager::advanceMemory(g_fileManager,this->areaSize - this->contentSize);
  }
  return;
}

Assistant:

void CDirectiveArea::Encode() const
{
	if (positionExpression.isLoaded())
	{
		Architecture::current().NextSection();
		g_fileManager->seekVirtual(position);
	}

	if (content)
		content->Encode();

	if (fillExpression.isLoaded())
	{
		int64_t subAreaUsage = Allocations::getSubAreaUsage(fileID, position);
		if (subAreaUsage != 0)
			g_fileManager->advanceMemory(subAreaUsage);

		unsigned char buffer[64];
		memset(buffer,fillValue,64);
		
		size_t writeSize = areaSize-contentSize-subAreaUsage;
		while (writeSize > 0)
		{
			size_t part = std::min<size_t>(64,writeSize);
			g_fileManager->write(buffer,part);
			writeSize -= part;
		}
	}
	else if (shared)
		g_fileManager->advanceMemory(areaSize-contentSize);
}